

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O1

Spectrum __thiscall
CMU462::GlassBSDF::sample_f(GlassBSDF *this,Vector3D *wo,Vector3D *wi,float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Spectrum SVar14;
  Vector3D wi_refract;
  
  iVar7 = (*(this->super_BSDF)._vptr_BSDF[5])(*(undefined4 *)&(this->super_BSDF).field_0x14);
  if ((char)iVar7 == '\0') {
    (*(this->super_BSDF)._vptr_BSDF[4])(this,wo,wi);
    *pdf = 1.0;
    fVar10 = (float)(1.0 / ABS(wi->z));
    fVar9 = (this->reflectance).r * fVar10;
    uVar1 = (this->reflectance).g;
    uVar4 = (this->reflectance).b;
    fVar11 = fVar10 * (float)uVar1;
    fVar10 = fVar10 * (float)uVar4;
  }
  else {
    fVar9 = *(float *)&(this->super_BSDF).field_0x14;
    if (wo->z < 0.0) {
      fVar10 = 1.0;
    }
    else {
      fVar10 = fVar9;
      fVar9 = 1.0;
    }
    iVar8 = (int)wo->z;
    iVar7 = -iVar8;
    if (0 < iVar8) {
      iVar7 = iVar8;
    }
    fVar12 = (float)iVar7;
    fVar13 = (fVar10 * fVar12 - fVar9 * 0.0) / (fVar10 * fVar12 + fVar9 * 0.0);
    fVar11 = (fVar9 * fVar12 - fVar10 * 0.0) / (fVar9 * fVar12 + fVar10 * 0.0);
    fVar13 = (fVar13 * fVar13 + fVar11 * fVar11) * 0.5;
    if (fVar13 <= 0.0) {
      fVar13 = 0.0;
    }
    if (1.0 <= fVar13) {
      fVar13 = 1.0;
    }
    iVar7 = rand();
    if (fVar13 <= (float)iVar7 / 2.1474836e+09) {
      wi->z = 0.0;
      wi->x = 0.0;
      wi->y = 0.0;
      fVar13 = 1.0 - fVar13;
      *pdf = fVar13;
      fVar12 = (((fVar10 * fVar10) / fVar9) / fVar9) / fVar12;
      uVar3 = (this->transmittance).g;
      uVar6 = (this->transmittance).b;
      fVar9 = (this->transmittance).r * fVar12 * fVar13;
      fVar11 = fVar13 * fVar12 * (float)uVar3;
      fVar10 = fVar13 * fVar12 * (float)uVar6;
    }
    else {
      (*(this->super_BSDF)._vptr_BSDF[4])(this,wo,wi);
      *pdf = fVar13;
      uVar2 = (this->reflectance).g;
      uVar5 = (this->reflectance).b;
      fVar10 = (float)(1.0 / ABS(wi->z));
      fVar9 = (this->reflectance).r * fVar13 * fVar10;
      fVar11 = fVar10 * fVar13 * (float)uVar2;
      fVar10 = fVar10 * fVar13 * (float)uVar5;
    }
  }
  SVar14.g = fVar11;
  SVar14.r = fVar9;
  SVar14.b = fVar10;
  return SVar14;
}

Assistant:

Spectrum GlassBSDF::sample_f(const Vector3D& wo, Vector3D* wi, float* pdf) {
	// TODO (PathTracer):
	Vector3D wi_refract;
	bool external = refract(wo, &wi_refract, ior);
	if (external) {
		float ni, nt, cos_theta_i, cos_theta_t;
		if (wo.z >= 0) {
			ni = 1.0;
			nt = ior;
		}
		else {
			ni = ior;
			nt = 1.0;
		}
		cos_theta_t = abs(wi_refract.z);
		cos_theta_i = abs(wo.z);

		// Compute Fresnel coefficient.
		float r_parallel = (nt* cos_theta_i - ni * cos_theta_t) / (nt * cos_theta_i + ni * cos_theta_t);
		float r_perpendicular = (ni* cos_theta_i - nt * cos_theta_t) / (ni * cos_theta_i + nt * cos_theta_t);
		float Fr = 0.5f*(r_parallel*r_parallel + r_perpendicular * r_perpendicular);
		Fr = std::min(1.0f, std::max(0.0f, Fr));

		// decide either reflect or refract based on it
		if ((double(rand()) / RAND_MAX) < Fr) {
			reflect(wo, wi);
			*pdf = Fr;
			return Fr * reflectance * (1.0 / abs_cos_theta(*wi));
		}
		else {
			*wi = wi_refract;
			*pdf = 1.0f - Fr;
			return transmittance * (nt * nt / ni / ni / cos_theta_i) * (1.0f - Fr);
		}
	}
	else {
		reflect(wo, wi);
		*pdf = 1.0f;
		return reflectance * (1.0 / abs_cos_theta(*wi));
	}
}